

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sColMap *psVar1;
  short sVar2;
  uint uVar3;
  sqlite3 *db;
  Table *pTVar4;
  byte bVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  FKey *data;
  RenameToken *pRVar10;
  FKey *pFVar11;
  ulong uVar12;
  Column *pCVar13;
  int iVar14;
  sColMap *z;
  char *pcVar15;
  char *pcVar16;
  char **ppcVar17;
  long lVar18;
  
  db = pParse->db;
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 == (Table *)0x0) || (pParse->eParseMode == '\x01')) {
LAB_0015d1df:
    if (pFromCol != (ExprList *)0x0) {
LAB_0015d1e4:
      exprListDeleteNN(db,pFromCol);
    }
  }
  else {
    if (pFromCol != (ExprList *)0x0) {
      uVar3 = pFromCol->nExpr;
      if (pToCol == (ExprList *)0x0) {
        iVar14 = uVar3 * 0x10 + pTo->n + 0x41;
LAB_0015d332:
        bVar5 = 0;
        goto LAB_0015d33a;
      }
      uVar8 = pToCol->nExpr;
      if (uVar8 == uVar3) {
        iVar14 = uVar3 * 0x10 + pTo->n + 0x41;
        if (0 < (int)uVar8) goto LAB_0015d2a6;
        bVar5 = 1;
        goto LAB_0015d33a;
      }
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
      goto LAB_0015d1e4;
    }
    if (0 < pTVar4->nCol) {
      if (pToCol == (ExprList *)0x0) {
        iVar14 = pTo->n + 0x51;
        uVar3 = 1;
        goto LAB_0015d332;
      }
      if (pToCol->nExpr != 1) {
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar4->aCol[(ushort)pTVar4->nCol - 1].zName,pTo);
        goto LAB_0015d1f4;
      }
      iVar14 = pTo->n + 0x51;
      uVar3 = 1;
      uVar8 = 1;
LAB_0015d2a6:
      uVar12 = (ulong)uVar8;
      ppcVar17 = &pToCol->a[0].zName;
      do {
        if (*ppcVar17 == (char *)0x0) {
          iVar7 = 1;
        }
        else {
          sVar9 = strlen(*ppcVar17);
          iVar7 = ((uint)sVar9 & 0x3fffffff) + 1;
        }
        iVar14 = iVar14 + iVar7;
        ppcVar17 = ppcVar17 + 4;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      bVar5 = 1;
LAB_0015d33a:
      data = (FKey *)sqlite3DbMallocZero(db,(long)iVar14);
      if (data == (FKey *)0x0) goto LAB_0015d1df;
      data->pFrom = pTVar4;
      data->pNextFrom = pTVar4->pFKey;
      z = data->aCol + (int)uVar3;
      data->zTo = (char *)z;
      if ((1 < pParse->eParseMode) &&
         (pRVar10 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20),
         pRVar10 != (RenameToken *)0x0)) {
        pRVar10->p = z;
        uVar8 = pTo->n;
        uVar6 = *(undefined4 *)&pTo->field_0xc;
        (pRVar10->t).z = pTo->z;
        (pRVar10->t).n = uVar8;
        *(undefined4 *)&(pRVar10->t).field_0xc = uVar6;
        pRVar10->pNext = pParse->pRename;
        pParse->pRename = pRVar10;
      }
      psVar1 = data->aCol;
      memcpy(z,pTo->z,(ulong)pTo->n);
      *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
      sqlite3Dequote((char *)z);
      uVar8 = pTo->n;
      data->nCol = uVar3;
      if (pFromCol == (ExprList *)0x0) {
        psVar1->iFrom = pTVar4->nCol + -1;
LAB_0015d505:
        if ((bool)(bVar5 & 0 < (int)uVar3)) {
          pcVar16 = (char *)((long)&z->iFrom + (ulong)(uVar8 + 1));
          uVar12 = 0;
          do {
            pcVar15 = pToCol->a[uVar12].zName;
            uVar8 = 0;
            if (pcVar15 != (char *)0x0) {
              sVar9 = strlen(pcVar15);
              uVar8 = (uint)sVar9 & 0x3fffffff;
            }
            data->aCol[uVar12].zCol = pcVar16;
            if (1 < pParse->eParseMode) {
              for (pRVar10 = pParse->pRename; pRVar10 != (RenameToken *)0x0;
                  pRVar10 = pRVar10->pNext) {
                if ((char *)pRVar10->p == pcVar15) {
                  pRVar10->p = pcVar16;
                  break;
                }
              }
            }
            memcpy(pcVar16,pcVar15,(ulong)uVar8);
            pcVar15 = pcVar16 + uVar8;
            pcVar16 = pcVar15 + 1;
            *pcVar15 = '\0';
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar3);
        }
      }
      else if (0 < (int)uVar3) {
        sVar2 = pTVar4->nCol;
        uVar12 = 0;
        do {
          if (sVar2 < 1) {
            uVar12 = 0;
LAB_0015d61e:
            sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                            pFromCol->a[uVar12].zName);
            goto LAB_0015d651;
          }
          pCVar13 = pTVar4->aCol;
          pcVar16 = pFromCol->a[uVar12].zName;
          lVar18 = 0;
          while (iVar14 = sqlite3StrICmp(pCVar13->zName,pcVar16), iVar14 != 0) {
            lVar18 = lVar18 + 1;
            pCVar13 = pCVar13 + 1;
            if (sVar2 == lVar18) {
              uVar12 = uVar12 & 0xffffffff;
              goto LAB_0015d61e;
            }
          }
          psVar1[uVar12].iFrom = (int)lVar18;
          if ((1 < pParse->eParseMode) && (pRVar10 = pParse->pRename, pRVar10 != (RenameToken *)0x0)
             ) {
            do {
              if ((char *)pRVar10->p == pcVar16) {
                pRVar10->p = psVar1 + uVar12;
                break;
              }
              pRVar10 = pRVar10->pNext;
            } while (pRVar10 != (RenameToken *)0x0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar3);
        goto LAB_0015d505;
      }
      data->isDeferred = '\0';
      data->aAction[0] = (u8)flags;
      data->aAction[1] = (u8)((uint)flags >> 8);
      pFVar11 = (FKey *)sqlite3HashInsert(&pTVar4->pSchema->fkeyHash,data->zTo,data);
      if (pFVar11 == data) {
        sqlite3OomFault(db);
LAB_0015d651:
        sqlite3DbFreeNN(db,data);
      }
      else {
        if (pFVar11 != (FKey *)0x0) {
          data->pNextTo = pFVar11;
          pFVar11->pPrevTo = data;
        }
        pTVar4->pFKey = data;
      }
      goto LAB_0015d1df;
    }
  }
  if (pToCol == (ExprList *)0x0) {
    return;
  }
LAB_0015d1f4:
  exprListDeleteNN(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zName);
      }
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}